

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3Reprepare(Vdbe *p)

{
  sqlite3 *db;
  Vdbe *pVVar1;
  Vdbe **ppVVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  Vdbe *pFromStmt;
  int iVar6;
  Vdbe *p_1;
  char *pcVar7;
  sqlite3_stmt *pNew;
  Vdbe tmp;
  Vdbe *local_158;
  undefined1 local_150 [304];
  
  if (p == (Vdbe *)0x0) {
    pcVar7 = (char *)0x0;
  }
  else {
    pcVar7 = p->zSql;
  }
  db = p->db;
  iVar6 = sqlite3LockAndPrepare
                    (db,pcVar7,-1,(uint)p->prepFlags,p,(sqlite3_stmt **)&local_158,(char **)0x0);
  pFromStmt = local_158;
  if (iVar6 == 0) {
    memcpy(local_150,local_158,0x130);
    memcpy(pFromStmt,p,0x130);
    memcpy(p,local_150,0x130);
    pVVar1 = pFromStmt->pVNext;
    pFromStmt->pVNext = p->pVNext;
    p->pVNext = pVVar1;
    ppVVar2 = pFromStmt->ppVPrev;
    pFromStmt->ppVPrev = p->ppVPrev;
    p->ppVPrev = ppVVar2;
    pcVar7 = pFromStmt->zSql;
    pFromStmt->zSql = p->zSql;
    p->zSql = pcVar7;
    p->expmask = pFromStmt->expmask;
    p->prepFlags = pFromStmt->prepFlags;
    uVar3 = *(undefined8 *)pFromStmt->aCounter;
    uVar4 = *(undefined8 *)(pFromStmt->aCounter + 2);
    uVar5 = *(undefined8 *)(pFromStmt->aCounter + 6);
    *(undefined8 *)(p->aCounter + 4) = *(undefined8 *)(pFromStmt->aCounter + 4);
    *(undefined8 *)(p->aCounter + 6) = uVar5;
    p->aCounter[8] = pFromStmt->aCounter[8];
    *(undefined8 *)p->aCounter = uVar3;
    *(undefined8 *)(p->aCounter + 2) = uVar4;
    p->aCounter[5] = p->aCounter[5] + 1;
    sqlite3TransferBindings((sqlite3_stmt *)pFromStmt,(sqlite3_stmt *)p);
    local_158->rc = 0;
    sqlite3VdbeFinalize(local_158);
    iVar6 = 0;
  }
  else if (iVar6 == 7) {
    sqlite3OomFault(db);
  }
  return iVar6;
}

Assistant:

SQLITE_PRIVATE int sqlite3Reprepare(Vdbe *p){
  int rc;
  sqlite3_stmt *pNew;
  const char *zSql;
  sqlite3 *db;
  u8 prepFlags;

  assert( sqlite3_mutex_held(sqlite3VdbeDb(p)->mutex) );
  zSql = sqlite3_sql((sqlite3_stmt *)p);
  assert( zSql!=0 );  /* Reprepare only called for prepare_v2() statements */
  db = sqlite3VdbeDb(p);
  assert( sqlite3_mutex_held(db->mutex) );
  prepFlags = sqlite3VdbePrepareFlags(p);
  rc = sqlite3LockAndPrepare(db, zSql, -1, prepFlags, p, &pNew, 0);
  if( rc ){
    if( rc==SQLITE_NOMEM ){
      sqlite3OomFault(db);
    }
    assert( pNew==0 );
    return rc;
  }else{
    assert( pNew!=0 );
  }
  sqlite3VdbeSwap((Vdbe*)pNew, p);
  sqlite3TransferBindings(pNew, (sqlite3_stmt*)p);
  sqlite3VdbeResetStepResult((Vdbe*)pNew);
  sqlite3VdbeFinalize((Vdbe*)pNew);
  return SQLITE_OK;
}